

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkDarDemiterDual(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Aig_Man_t *local_820;
  Aig_Man_t *pPart1;
  Aig_Man_t *pPart0;
  Aig_Man_t *pMan;
  char pFileName1 [1000];
  char local_418 [8];
  char pFileName0 [1000];
  char *pFileNameGeneric;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  uVar1 = Abc_NtkPoNum(pNtk);
  if ((uVar1 & 1) == 0) {
    pPart0 = Abc_NtkToDar(pNtk,0,1);
    if (pPart0 == (Aig_Man_t *)0x0) {
      Abc_Print(1,"Converting network into AIG has failed.\n");
      pNtk_local._4_4_ = 0;
    }
    else {
      iVar2 = Saig_ManDemiterDual(pPart0,&pPart1,&local_820);
      if (iVar2 == 0) {
        Abc_Print(1,"Demitering has failed.\n");
        pNtk_local._4_4_ = 0;
      }
      else {
        if (pPart1->pName != (char *)0x0) {
          free(pPart1->pName);
          pPart1->pName = (char *)0x0;
        }
        pcVar3 = Abc_UtilStrsav("part0");
        pPart1->pName = pcVar3;
        if (local_820->pName != (char *)0x0) {
          free(local_820->pName);
          local_820->pName = (char *)0x0;
        }
        pcVar3 = Abc_UtilStrsav("part1");
        local_820->pName = pcVar3;
        pcVar3 = Extra_FileNameGeneric(pNtk->pSpec);
        sprintf(local_418,"%s","part0.aig");
        sprintf((char *)&pMan,"%s","part1.aig");
        if (pcVar3 != (char *)0x0) {
          free(pcVar3);
        }
        Ioa_WriteAiger(pPart1,local_418,0,0);
        Ioa_WriteAiger(local_820,(char *)&pMan,0,0);
        Abc_Print(1,"Demitering produced two files \"%s\" and \"%s\".\n",local_418,&pMan);
        if (fVerbose != 0) {
          Aig_ManPrintStats(pPart0);
          Aig_ManPrintStats(pPart1);
          Aig_ManPrintStats(local_820);
        }
        Aig_ManStop(pPart1);
        Aig_ManStop(local_820);
        Aig_ManStop(pPart0);
        pNtk_local._4_4_ = 1;
      }
    }
  }
  else {
    Abc_Print(1,"The number of POs should be even.\n");
    pNtk_local._4_4_ = 0;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkDarDemiterDual( Abc_Ntk_t * pNtk, int fVerbose )
{ 
    char * pFileNameGeneric, pFileName0[1000], pFileName1[1000];
    Aig_Man_t * pMan, * pPart0, * pPart1;//, * pMiter;
    if ( (Abc_NtkPoNum(pNtk) & 1) )
    {
        Abc_Print( 1, "The number of POs should be even.\n" );
        return 0;
    }
    // derive the AIG manager
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting network into AIG has failed.\n" );
        return 0;
    }
//    if ( !Saig_ManDemiterSimple( pMan, &pPart0, &pPart1 ) )
    if ( !Saig_ManDemiterDual( pMan, &pPart0, &pPart1 ) )
    {
        Abc_Print( 1, "Demitering has failed.\n" );
        return 0;
    }
    // create new AIG
    ABC_FREE( pPart0->pName );
    pPart0->pName = Abc_UtilStrsav( "part0" );
    // create new AIGs
    ABC_FREE( pPart1->pName );
    pPart1->pName = Abc_UtilStrsav( "part1" );
    // create file names
    pFileNameGeneric = Extra_FileNameGeneric( pNtk->pSpec );
//    sprintf( pFileName0,  "%s%s",  pFileNameGeneric, "_part0.aig" ); 
//    sprintf( pFileName1,  "%s%s",  pFileNameGeneric, "_part1.aig" ); 
    sprintf( pFileName0,  "%s",  "part0.aig" ); 
    sprintf( pFileName1,  "%s",  "part1.aig" ); 
    ABC_FREE( pFileNameGeneric );
    Ioa_WriteAiger( pPart0, pFileName0, 0, 0 );
    Ioa_WriteAiger( pPart1, pFileName1, 0, 0 );
    Abc_Print( 1, "Demitering produced two files \"%s\" and \"%s\".\n", pFileName0, pFileName1 );
    // dump files
    if ( fVerbose )
    {
//        Abc_Print( 1, "Init:  " );
        Aig_ManPrintStats( pMan );
//        Abc_Print( 1, "Part1: " );
        Aig_ManPrintStats( pPart0 );
//        Abc_Print( 1, "Part2: " );
        Aig_ManPrintStats( pPart1 );
    }
    // create two-level miter
//    pMiter = Saig_ManCreateMiterTwo( pPart0, pPart1, 2 );
//    Aig_ManDumpBlif( pMiter, "miter01.blif", NULL, NULL );
//    Aig_ManStop( pMiter );
//    Abc_Print( 1, "The new miter is written into file \"%s\".\n", "miter01.blif" );
    Aig_ManStop( pPart0 );
    Aig_ManStop( pPart1 );
    Aig_ManStop( pMan );
    return 1;
}